

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::writeHSharedObject(QPDF *this,BitWriter *w)

{
  ulong uVar1;
  HSharedObject *this_00;
  pointer pMVar2;
  unsigned_long_long val;
  size_t sVar3;
  reference pvVar4;
  allocator<char> local_59;
  string local_58;
  ulong local_38;
  size_t i;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *entries;
  HSharedObject *pHStack_20;
  int nitems;
  HSharedObject *t;
  BitWriter *w_local;
  QPDF *this_local;
  
  t = (HSharedObject *)w;
  w_local = (BitWriter *)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pHStack_20 = &pMVar2->shared_object_hints;
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->first_shared_obj,0x20);
  this_00 = t;
  val = toULL<long_long>(&pHStack_20->first_shared_offset);
  BitWriter::writeBits((BitWriter *)this_00,val,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nshared_first_page,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nshared_total,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_nobjects,0x10);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->min_group_length,0x20);
  BitWriter::writeBitsInt((BitWriter *)t,pHStack_20->nbits_delta_group_length,0x10);
  QTC::TC("qpdf","QPDF lin write nshared_total > nshared_first_page",
          (uint)(pHStack_20->nshared_first_page < pHStack_20->nshared_total));
  entries._4_4_ = pHStack_20->nshared_total;
  i = (size_t)&pHStack_20->entries;
  write_vector_int<QPDF::HSharedObjectEntry,int>
            ((BitWriter *)t,entries._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)i,
             pHStack_20->nbits_delta_group_length,0);
  write_vector_int<QPDF::HSharedObjectEntry,int>
            ((BitWriter *)t,entries._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)i,1,4);
  for (local_38 = 0; uVar1 = local_38, sVar3 = toS<int>((int *)((long)&entries + 4)), uVar1 < sVar3;
      local_38 = local_38 + 1) {
    pvVar4 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       ((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                         *)i,local_38);
    if (pvVar4->signature_present != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "found unexpected signature present while writing linearization data",&local_59);
      stopOnError(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
  }
  write_vector_int<QPDF::HSharedObjectEntry,int>
            ((BitWriter *)t,entries._4_4_,
             (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)i,
             pHStack_20->nbits_nobjects,8);
  return;
}

Assistant:

void
QPDF::writeHSharedObject(BitWriter& w)
{
    HSharedObject& t = m->shared_object_hints;

    w.writeBitsInt(t.first_shared_obj, 32);         // 1
    w.writeBits(toULL(t.first_shared_offset), 32);  // 2
    w.writeBitsInt(t.nshared_first_page, 32);       // 3
    w.writeBitsInt(t.nshared_total, 32);            // 4
    w.writeBitsInt(t.nbits_nobjects, 16);           // 5
    w.writeBitsInt(t.min_group_length, 32);         // 6
    w.writeBitsInt(t.nbits_delta_group_length, 16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin write nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    int nitems = t.nshared_total;
    std::vector<HSharedObjectEntry>& entries = t.entries;

    write_vector_int(
        w, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    write_vector_int(w, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        // If signature were present, we'd have to write a 128-bit hash.
        if (entries.at(i).signature_present != 0) {
            stopOnError("found unexpected signature present while writing linearization data");
        }
    }
    write_vector_int(w, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}